

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O2

void __thiscall Js::StringProfiler::RecordNewString(StringProfiler *this,char16 *sz,uint length)

{
  BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  undefined1 local_48 [8];
  StringMetrics metrics;
  uint local_34 [2];
  uint length_local;
  
  local_34[0] = length;
  bVar3 = IsOnWrongThread(this);
  if (bVar3) {
    LOCK();
    this->discardedWrongThread = this->discardedWrongThread + 1;
    UNLOCK();
  }
  else {
    if (sz == (char16 *)0x0) {
      metrics.countUnicode = 0;
    }
    else {
      metrics.countUnicode = GetRequiredEncoding(sz,length);
    }
    metrics.count7BitASCII = 0;
    local_48._0_4_ = 0;
    local_48._4_4_ = 0;
    this_00 = &this->stringLengthMetrics;
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>(this_00,local_34,(StringMetrics *)local_48);
    StringMetrics::Accumulate((StringMetrics *)local_48,metrics.countUnicode);
    if (bVar3) {
      JsUtil::
      BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                ((BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00,local_34,(StringMetrics *)local_48);
    }
    else {
      JsUtil::
      BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00,local_34,(StringMetrics *)local_48);
    }
    if (sz != (char16 *)0x0) {
      uVar4 = CountEmbeddedNULs(sz,local_34[0]);
      if (uVar4 != 0) {
        uVar1 = this->embeddedNULChars;
        uVar2 = this->embeddedNULStrings;
        auVar5 = pmovsxbd(in_XMM1,0x1010101);
        this->embeddedNULChars = uVar4 + uVar1;
        this->embeddedNULStrings = auVar5._4_4_ + uVar2;
      }
    }
  }
  return;
}

Assistant:

void StringProfiler::RecordNewString( const char16* sz, uint length )
    {
        if( IsOnWrongThread() )
        {
            ::InterlockedIncrement(&discardedWrongThread);
            return;
        }
        RequiredEncoding encoding = ASCII7bit;
        if(sz)
        {
            encoding = GetRequiredEncoding(sz, length);
        }

        StringMetrics metrics = {};

        if( stringLengthMetrics.TryGetValue(length, &metrics) )
        {
            metrics.Accumulate(encoding);
            stringLengthMetrics.Item(length,metrics);
        }
        else
        {
            metrics.Accumulate(encoding);
            stringLengthMetrics.Add(length,metrics);
        }

        if(sz)
        {
            uint embeddedNULs = CountEmbeddedNULs(sz, length);
            if( embeddedNULs != 0 )
            {

                this->embeddedNULChars += embeddedNULs;
                this->embeddedNULStrings++;
            }
        }
    }